

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

Function * __thiscall backend::codegen::Codegen::translate_function(Codegen *this)

{
  ConditionCode CVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  reference puVar6;
  void *this_00;
  LastJump *pLVar7;
  pointer ppVar8;
  pointer pIVar9;
  ostream *poVar10;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
  *inst;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>,_true>
  this_01;
  long *in_RSI;
  Function *in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_bool>
  pVar12;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>,_false,_true>,_bool>
  pVar13;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
  *map;
  iterator data;
  pair<const_mir::inst::VarId,_unsigned_int> *v;
  iterator __end2_1;
  iterator __begin2_1;
  map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
  *__range2_1;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *i_2;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *__range2;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *i_1;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *__range3;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *i;
  iterator __end5;
  iterator __begin5;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *__range5;
  bool inverted;
  LabelId expected_bb;
  ConditionCode cond;
  iterator next_hint;
  uint next_bb;
  bool can_inline;
  iterator hint;
  optional<arm::ConditionCode> second_last_cond;
  mapped_type *bb;
  uint bb_id;
  iterator it;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> vis;
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  inst_sink;
  ostream *in_stack_ffffffffffffee18;
  Function *in_stack_ffffffffffffee20;
  undefined4 in_stack_ffffffffffffee28;
  undefined4 in_stack_ffffffffffffee2c;
  uint32_t stack_size;
  Function *in_stack_ffffffffffffee30;
  const_iterator in_stack_ffffffffffffee38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  *in_stack_ffffffffffffee40;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
  *ty;
  iterator in_stack_ffffffffffffee48;
  undefined7 in_stack_ffffffffffffee50;
  undefined1 in_stack_ffffffffffffee57;
  char *in_stack_ffffffffffffee58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee60;
  Codegen *in_stack_ffffffffffffee70;
  Codegen *in_stack_ffffffffffffee80;
  Timestamp *in_stack_ffffffffffffeea8;
  ostream *in_stack_ffffffffffffeeb0;
  Codegen *in_stack_ffffffffffffeef0;
  allocator<char> *in_stack_ffffffffffffef18;
  ostream *in_stack_ffffffffffffef20;
  Codegen *in_stack_ffffffffffffef50;
  bool local_ec1;
  undefined7 in_stack_fffffffffffff148;
  shared_ptr<mir::types::FunctionTy> local_e88;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>,_true>
  local_e78;
  undefined1 local_e70;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
  *local_e18;
  _Base_ptr local_e10;
  _Base_ptr local_e08;
  undefined1 local_e00;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined8 local_de8;
  undefined8 uStack_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  _Self local_d88;
  _Self local_d80;
  allocator<char> local_d71;
  string local_d70 [39];
  allocator<char> local_d49;
  string local_d48 [120];
  time_point_sys_clock local_cd0;
  Timestamp local_cc8;
  Codegen *in_stack_fffffffffffff360;
  ostream local_c79;
  string local_c78 [39];
  allocator<char> local_c51;
  string local_c50 [120];
  time_point_sys_clock local_bd8;
  Timestamp local_bd0 [3];
  undefined1 local_b82;
  allocator<char> local_b81;
  string local_b80 [39];
  allocator<char> local_b59;
  string local_b58 [120];
  time_point_sys_clock local_ae0;
  Timestamp local_ad8 [3];
  undefined1 local_a8a;
  allocator<char> local_a89;
  string local_a88 [39];
  ostream local_a61;
  string local_a60 [120];
  time_point_sys_clock local_9e8;
  Timestamp local_9e0 [3];
  undefined1 local_991;
  reference local_990;
  _Self local_988;
  _Self local_980;
  long *local_978;
  allocator<char> local_969;
  string local_968 [39];
  allocator<char> local_941;
  string local_940 [120];
  time_point_sys_clock local_8c8;
  Timestamp local_8c0 [3];
  undefined1 local_871;
  reference local_870;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_868;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_860;
  long *local_858;
  uint *local_850;
  reference local_848;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_840;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_838;
  long *local_830;
  undefined2 local_822;
  reference local_820;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_818;
  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
  local_810;
  long *local_808;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_800;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_7f8;
  unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *local_7f0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_7e0;
  uint *local_7d8;
  uint *local_7d0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_7c8;
  uint *local_7c0;
  uint *local_7b8;
  undefined1 local_7a9;
  LabelId local_7a8;
  ConditionCode local_7a2;
  allocator<char> local_7a1;
  string local_7a0 [39];
  allocator<char> local_779;
  string local_778 [120];
  time_point_sys_clock local_700;
  Timestamp local_6f8 [3];
  undefined1 local_6aa;
  allocator<char> local_6a9;
  string local_6a8 [39];
  allocator<char> local_681;
  string local_680 [120];
  time_point_sys_clock local_608;
  Timestamp local_600 [3];
  undefined1 local_5b2;
  allocator<char> local_5b1;
  string local_5b0 [39];
  allocator<char> local_589;
  string local_588 [120];
  time_point_sys_clock local_510;
  Timestamp local_508 [3];
  undefined1 local_4ba;
  allocator<char> local_4b9;
  string local_4b8 [39];
  allocator<char> local_491;
  string local_490 [120];
  time_point_sys_clock local_418;
  Timestamp local_410 [3];
  undefined1 local_3c2;
  allocator<char> local_3c1;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [120];
  time_point_sys_clock local_320;
  Timestamp local_318 [3];
  undefined1 local_2c9;
  _Self local_2c8;
  _Base_ptr local_2c0;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_2b8;
  uint local_2b0;
  allocator<char> local_2a9;
  string local_2a8 [39];
  allocator<char> local_281;
  string local_280 [120];
  time_point_sys_clock local_208;
  Timestamp local_200 [3];
  undefined1 local_1b3;
  byte local_1b2;
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [120];
  time_point_sys_clock local_110;
  Timestamp local_108 [3];
  undefined1 local_b9;
  _Self local_b8;
  _Self local_b0;
  undefined2 local_a4;
  undefined2 local_a2;
  Codegen *local_a0;
  undefined1 local_98;
  uint local_7c;
  mapped_type *local_78;
  uint local_6c;
  uint *local_68;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60 [12];
  
  init_reg_map(in_stack_ffffffffffffee70);
  scan_stack(in_stack_ffffffffffffee80);
  scan(in_stack_fffffffffffff360);
  generate_startup(in_stack_ffffffffffffeef0);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::vector((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            *)in_stack_ffffffffffffee20,
           (vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            *)in_stack_ffffffffffffee18);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x20a5fc);
  local_60[0]._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          in_stack_ffffffffffffee18);
  while( true ) {
    local_68 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  in_stack_ffffffffffffee18);
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffee20,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffee18);
    if (!bVar4) break;
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(local_60);
    local_6c = *puVar6;
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::clear((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             *)0x20a679);
    local_7c = local_6c;
    local_78 = std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     *)in_stack_ffffffffffffee40,(key_type *)in_stack_ffffffffffffee38._M_current);
    pVar11 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                       ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )in_stack_ffffffffffffee40,
                        (value_type *)in_stack_ffffffffffffee38._M_current);
    local_a0 = (Codegen *)pVar11.first._M_node;
    local_98 = pVar11.second;
    translate_basic_block(local_a0,(BasicBlk *)CONCAT17(local_98,in_stack_fffffffffffff148));
    local_a2 = (undefined2)in_RSI[0x3d];
    std::optional<arm::ConditionCode>::optional((optional<arm::ConditionCode> *)0x20a73c);
    *(undefined2 *)(in_RSI + 0x3d) = local_a4;
    local_b0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
         ::find((map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                 *)in_stack_ffffffffffffee18,(key_type_conflict *)0x20a767);
    local_ec1 = false;
    if ((*(byte *)((long)in_RSI + 0x21c) & 1) != 0) {
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
           ::end((map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                  *)in_stack_ffffffffffffee18);
      local_ec1 = std::operator!=(&local_b0,&local_b8);
    }
    if (local_ec1 != false) {
      local_b9 = 0;
      AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
      AixLog::Tag::Tag((Tag *)0x20a816);
      AixLog::operator<<((ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                         (Tag *)in_stack_ffffffffffffee48._M_node);
      local_110.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      AixLog::Timestamp::Timestamp(local_108,&local_110);
      AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
      AixLog::Function::Function
                (in_stack_ffffffffffffee30,
                 (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
                 (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
      poVar10 = AixLog::operator<<((ostream *)
                                   CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                                   (Function *)in_stack_ffffffffffffee48._M_node);
      poVar10 = std::operator<<(poVar10,"Found inline hint for ");
      this_00 = (void *)std::ostream::operator<<(poVar10,local_6c);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      AixLog::Function::~Function(in_stack_ffffffffffffee20);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator(&local_189);
      AixLog::Timestamp::~Timestamp(local_108);
      AixLog::Tag::~Tag((Tag *)0x20a9d0);
      local_1b2 = std::optional<backend::codegen::LastJump>::has_value
                            ((optional<backend::codegen::LastJump> *)0x20a9e4);
      uVar2 = local_6c;
      if ((bool)local_1b2) {
        pLVar7 = std::optional<backend::codegen::LastJump>::operator->
                           ((optional<backend::codegen::LastJump> *)0x20aa1d);
        uVar3 = local_6c;
        if ((uVar2 != pLVar7->bb_true) &&
           (pLVar7 = std::optional<backend::codegen::LastJump>::operator->
                               ((optional<backend::codegen::LastJump> *)0x20aa52),
           uVar3 != pLVar7->bb_false)) {
          local_1b2 = 0;
          local_1b3 = 0;
          AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
          AixLog::Tag::Tag((Tag *)0x20aaa0);
          AixLog::operator<<((ostream *)
                             CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                             (Tag *)in_stack_ffffffffffffee48._M_node);
          local_208.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          AixLog::Timestamp::Timestamp(local_200,&local_208);
          AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
          AixLog::Function::Function
                    (in_stack_ffffffffffffee30,
                     (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
                     (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
          poVar10 = AixLog::operator<<((ostream *)
                                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50)
                                       ,(Function *)in_stack_ffffffffffffee48._M_node);
          poVar10 = std::operator<<(poVar10,"Inline ruined by not next to source basic block");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          AixLog::Function::~Function(in_stack_ffffffffffffee20);
          std::__cxx11::string::~string(local_2a8);
          std::allocator<char>::~allocator(&local_2a9);
          std::__cxx11::string::~string(local_280);
          std::allocator<char>::~allocator(&local_281);
          AixLog::Timestamp::~Timestamp(local_200);
          AixLog::Tag::~Tag((Tag *)0x20ac3c);
        }
        local_2b8 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator+((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
                                (difference_type)in_stack_ffffffffffffee20);
        puVar6 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_2b8);
        local_2b0 = *puVar6;
        if ((local_78->jump).kind == BrCond) {
          local_2c0 = (_Base_ptr)
                      std::
                      map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                      ::find((map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                              *)in_stack_ffffffffffffee18,(key_type_conflict *)0x20ae88);
          local_2c8._M_node =
               (_Base_ptr)
               std::
               map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
               ::end((map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                      *)in_stack_ffffffffffffee18);
          bVar5 = std::operator!=(&local_b0,&local_2c8);
          bVar4 = false;
          if (bVar5) {
            ppVar8 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_>::
                     operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_>
                                 *)in_stack_ffffffffffffee20);
            CVar1 = ppVar8->second;
            ppVar8 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_>::
                     operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_>
                                 *)in_stack_ffffffffffffee20);
            bVar4 = CVar1 != ppVar8->second;
          }
          if (bVar4) {
            local_1b2 = 0;
            local_2c9 = 0;
            AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
            AixLog::Tag::Tag((Tag *)0x20af6b);
            AixLog::operator<<((ostream *)
                               CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                               (Tag *)in_stack_ffffffffffffee48._M_node);
            local_320.__d.__r = (duration)std::chrono::_V2::system_clock::now();
            AixLog::Timestamp::Timestamp(local_318,&local_320);
            AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
            AixLog::Function::Function
                      (in_stack_ffffffffffffee30,
                       (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
                       (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
            poVar10 = AixLog::operator<<((ostream *)
                                         CONCAT17(in_stack_ffffffffffffee57,
                                                  in_stack_ffffffffffffee50),
                                         (Function *)in_stack_ffffffffffffee48._M_node);
            std::operator<<(poVar10,"Inline ruined by hint not matching (this: ");
            AixLog::Function::~Function(in_stack_ffffffffffffee20);
            std::__cxx11::string::~string(local_3c0);
            std::allocator<char>::~allocator(&local_3c1);
            std::__cxx11::string::~string(local_398);
            std::allocator<char>::~allocator(&local_399);
            AixLog::Timestamp::~Timestamp(local_318);
            AixLog::Tag::~Tag((Tag *)0x20b0e9);
            std::_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_> *)
                       in_stack_ffffffffffffee20);
            local_3c2 = 0;
            AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
            AixLog::Tag::Tag((Tag *)0x20b133);
            AixLog::operator<<((ostream *)
                               CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                               (Tag *)in_stack_ffffffffffffee48._M_node);
            local_418.__d.__r = (duration)std::chrono::_V2::system_clock::now();
            AixLog::Timestamp::Timestamp(local_410,&local_418);
            AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
            AixLog::Function::Function
                      (in_stack_ffffffffffffee30,
                       (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
                       (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
            AixLog::operator<<((ostream *)
                               CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                               (Function *)in_stack_ffffffffffffee48._M_node);
            arm::display_cond((ConditionCode)((ulong)in_stack_ffffffffffffee20 >> 0x38),
                              in_stack_ffffffffffffee18);
            AixLog::Function::~Function(in_stack_ffffffffffffee20);
            std::__cxx11::string::~string(local_4b8);
            std::allocator<char>::~allocator(&local_4b9);
            std::__cxx11::string::~string(local_490);
            std::allocator<char>::~allocator(&local_491);
            AixLog::Timestamp::~Timestamp(local_410);
            AixLog::Tag::~Tag((Tag *)0x20b2b4);
            local_4ba = 0;
            AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
            AixLog::Tag::Tag((Tag *)0x20b2e7);
            AixLog::operator<<((ostream *)
                               CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                               (Tag *)in_stack_ffffffffffffee48._M_node);
            local_510.__d.__r = (duration)std::chrono::_V2::system_clock::now();
            AixLog::Timestamp::Timestamp(local_508,&local_510);
            AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
            AixLog::Function::Function
                      (in_stack_ffffffffffffee30,
                       (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
                       (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
            poVar10 = AixLog::operator<<((ostream *)
                                         CONCAT17(in_stack_ffffffffffffee57,
                                                  in_stack_ffffffffffffee50),
                                         (Function *)in_stack_ffffffffffffee48._M_node);
            std::operator<<(poVar10,", next: ");
            AixLog::Function::~Function(in_stack_ffffffffffffee20);
            std::__cxx11::string::~string(local_5b0);
            std::allocator<char>::~allocator(&local_5b1);
            std::__cxx11::string::~string(local_588);
            std::allocator<char>::~allocator(&local_589);
            AixLog::Timestamp::~Timestamp(local_508);
            AixLog::Tag::~Tag((Tag *)0x20b465);
            std::_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_unsigned_int,_arm::ConditionCode>_> *)
                       in_stack_ffffffffffffee20);
            local_5b2 = 0;
            AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
            AixLog::Tag::Tag((Tag *)0x20b4af);
            AixLog::operator<<((ostream *)
                               CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                               (Tag *)in_stack_ffffffffffffee48._M_node);
            local_608.__d.__r = (duration)std::chrono::_V2::system_clock::now();
            AixLog::Timestamp::Timestamp(local_600,&local_608);
            AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
            AixLog::Function::Function
                      (in_stack_ffffffffffffee30,
                       (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
                       (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
            AixLog::operator<<((ostream *)
                               CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                               (Function *)in_stack_ffffffffffffee48._M_node);
            arm::display_cond((ConditionCode)((ulong)in_stack_ffffffffffffee20 >> 0x38),
                              in_stack_ffffffffffffee18);
            AixLog::Function::~Function(in_stack_ffffffffffffee20);
            std::__cxx11::string::~string(local_6a8);
            std::allocator<char>::~allocator(&local_6a9);
            std::__cxx11::string::~string(local_680);
            std::allocator<char>::~allocator(&local_681);
            AixLog::Timestamp::~Timestamp(local_600);
            AixLog::Tag::~Tag((Tag *)0x20b630);
            local_6aa = 0;
            AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
            AixLog::Tag::Tag((Tag *)0x20b663);
            AixLog::operator<<((ostream *)
                               CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                               (Tag *)in_stack_ffffffffffffee48._M_node);
            local_700.__d.__r = (duration)std::chrono::_V2::system_clock::now();
            AixLog::Timestamp::Timestamp(local_6f8,&local_700);
            AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
                       (allocator<char> *)
                       CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
            AixLog::Function::Function
                      (in_stack_ffffffffffffee30,
                       (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
                       (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
            poVar10 = AixLog::operator<<((ostream *)
                                         CONCAT17(in_stack_ffffffffffffee57,
                                                  in_stack_ffffffffffffee50),
                                         (Function *)in_stack_ffffffffffffee48._M_node);
            std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
            AixLog::Function::~Function(in_stack_ffffffffffffee20);
            std::__cxx11::string::~string(local_7a0);
            std::allocator<char>::~allocator(&local_7a1);
            std::__cxx11::string::~string(local_778);
            std::allocator<char>::~allocator(&local_779);
            AixLog::Timestamp::~Timestamp(local_6f8);
            AixLog::Tag::~Tag((Tag *)0x20b7e1);
          }
        }
      }
      uVar2 = local_6c;
      if ((local_1b2 & 1) != 0) {
        pLVar7 = std::optional<backend::codegen::LastJump>::operator->
                           ((optional<backend::codegen::LastJump> *)0x20bca2);
        if (uVar2 == pLVar7->bb_true) {
          pLVar7 = std::optional<backend::codegen::LastJump>::operator->
                             ((optional<backend::codegen::LastJump> *)0x20bcc9);
          local_7a2 = pLVar7->cond;
          pLVar7 = std::optional<backend::codegen::LastJump>::operator->
                             ((optional<backend::codegen::LastJump> *)0x20bce6);
          local_7a8 = pLVar7->bb_false;
          local_7a9 = 0;
          local_7b8 = (uint *)__gnu_cxx::
                              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              ::operator+((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                           *)CONCAT44(in_stack_ffffffffffffee2c,
                                                      in_stack_ffffffffffffee28),
                                          (difference_type)in_stack_ffffffffffffee20);
          local_7c0 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         in_stack_ffffffffffffee18);
          bVar5 = __gnu_cxx::operator!=
                            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)in_stack_ffffffffffffee20,
                             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)in_stack_ffffffffffffee18);
          bVar4 = false;
          if (bVar5) {
            local_7c8 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator+((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28)
                                    ,(difference_type)in_stack_ffffffffffffee20);
            puVar6 = __gnu_cxx::
                     __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator*(&local_7c8);
            uVar2 = *puVar6;
            pLVar7 = std::optional<backend::codegen::LastJump>::operator->
                               ((optional<backend::codegen::LastJump> *)0x20bd99);
            bVar4 = uVar2 == pLVar7->bb_false;
          }
          if (bVar4) {
            std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::pop_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)0x20bdca);
            std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::pop_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)0x20bdd7);
          }
        }
        else {
          pLVar7 = std::optional<backend::codegen::LastJump>::operator->
                             ((optional<backend::codegen::LastJump> *)0x20bdf4);
          local_7a2 = arm::invert_cond(pLVar7->cond);
          pLVar7 = std::optional<backend::codegen::LastJump>::operator->
                             ((optional<backend::codegen::LastJump> *)0x20be27);
          local_7a8 = pLVar7->bb_true;
          local_7a9 = 1;
          local_7d0 = (uint *)__gnu_cxx::
                              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              ::operator+((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                           *)CONCAT44(in_stack_ffffffffffffee2c,
                                                      in_stack_ffffffffffffee28),
                                          (difference_type)in_stack_ffffffffffffee20);
          local_7d8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                         in_stack_ffffffffffffee18);
          bVar5 = __gnu_cxx::operator!=
                            ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)in_stack_ffffffffffffee20,
                             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)in_stack_ffffffffffffee18);
          bVar4 = false;
          if (bVar5) {
            local_7e0 = __gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator+((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28)
                                    ,(difference_type)in_stack_ffffffffffffee20);
            puVar6 = __gnu_cxx::
                     __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                     ::operator*(&local_7e0);
            uVar2 = *puVar6;
            pLVar7 = std::optional<backend::codegen::LastJump>::operator->
                               ((optional<backend::codegen::LastJump> *)0x20beda);
            bVar4 = uVar2 == pLVar7->bb_true;
          }
          if (bVar4) {
            std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::pop_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)0x20bf0b);
            std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::pop_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        *)0x20bf18);
          }
          else {
            local_7f8 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                        std::
                        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                               *)in_stack_ffffffffffffee18);
            local_7f0 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                        __gnu_cxx::
                        __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                        ::operator-((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                                     *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28)
                                    ,(difference_type)in_stack_ffffffffffffee20);
            __gnu_cxx::
            __normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>const*,std::vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>>
            ::__normal_iterator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>*>
                      ((__normal_iterator<const_std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                        *)in_stack_ffffffffffffee20,
                       (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                        *)in_stack_ffffffffffffee18);
            local_800 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                        std::
                        vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                        ::erase((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                                 *)in_stack_ffffffffffffee30,in_stack_ffffffffffffee38);
            pLVar7 = std::optional<backend::codegen::LastJump>::operator->
                               ((optional<backend::codegen::LastJump> *)0x20bfac);
            CVar1 = pLVar7->cond;
            std::
            vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
            ::back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    *)in_stack_ffffffffffffee20);
            pIVar9 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator->
                               ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)0x20bfca);
            pIVar9->cond = CVar1;
          }
        }
        local_808 = in_RSI + 3;
        local_810._M_current =
             (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
             std::
             vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      *)in_stack_ffffffffffffee18);
        local_818 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                    std::
                    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                    ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                           *)in_stack_ffffffffffffee18);
        while (bVar4 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                                   *)in_stack_ffffffffffffee20,
                                  (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                                   *)in_stack_ffffffffffffee18), bVar4) {
          local_820 = __gnu_cxx::
                      __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                      ::operator*(&local_810);
          CVar1 = local_7a2;
          pIVar9 = std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>::operator->
                             ((unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)0x20c05f);
          pIVar9->cond = CVar1;
          __gnu_cxx::
          __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
          ::operator++(&local_810);
        }
        std::optional<arm::ConditionCode>::optional<arm::ConditionCode_&,_true>
                  ((optional<arm::ConditionCode> *)in_stack_ffffffffffffee20,
                   (ConditionCode *)in_stack_ffffffffffffee18);
        *(undefined2 *)(in_RSI + 0x3d) = local_822;
      }
    }
    local_830 = in_RSI + 3;
    local_838._M_current =
         (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
         std::
         vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
         ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                  *)in_stack_ffffffffffffee18);
    local_840 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
                std::
                vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                       *)in_stack_ffffffffffffee18);
    while (bVar4 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                               *)in_stack_ffffffffffffee20,
                              (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                               *)in_stack_ffffffffffffee18), bVar4) {
      local_848 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                  ::operator*(&local_838);
      std::
      vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                   *)in_stack_ffffffffffffee20,(value_type *)in_stack_ffffffffffffee18);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
      ::operator++(&local_838);
    }
    local_850 = (uint *)__gnu_cxx::
                        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28
                                                ),(int)((ulong)in_stack_ffffffffffffee20 >> 0x20));
  }
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::clear((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
           *)0x20c16b);
  generate_return_and_cleanup(in_stack_ffffffffffffef50);
  local_858 = in_RSI + 3;
  local_860._M_current =
       (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
       std::
       vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
       ::begin((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                *)in_stack_ffffffffffffee18);
  local_868 = (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)
              std::
              vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              ::end((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                     *)in_stack_ffffffffffffee18);
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                             *)in_stack_ffffffffffffee20,
                            (__normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                             *)in_stack_ffffffffffffee18), bVar4) {
    local_870 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
                ::operator*(&local_860);
    std::
    vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                 *)in_stack_ffffffffffffee20,(value_type *)in_stack_ffffffffffffee18);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_*,_std::vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>_>
    ::operator++(&local_860);
  }
  local_871 = 0;
  AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
  AixLog::Tag::Tag((Tag *)0x20c243);
  AixLog::operator<<((ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                     (Tag *)in_stack_ffffffffffffee48._M_node);
  local_8c8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_8c0,&local_8c8);
  AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
  AixLog::Function::Function
            (in_stack_ffffffffffffee30,
             (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
             (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
  poVar10 = AixLog::operator<<((ostream *)
                               CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                               (Function *)in_stack_ffffffffffffee48._M_node);
  poVar10 = std::operator<<(poVar10,"VariableToReg: ");
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  AixLog::Function::~Function(in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_968);
  std::allocator<char>::~allocator(&local_969);
  std::__cxx11::string::~string(local_940);
  std::allocator<char>::~allocator(&local_941);
  AixLog::Timestamp::~Timestamp(local_8c0);
  AixLog::Tag::~Tag((Tag *)0x20c3df);
  local_978 = in_RSI + 6;
  local_980._M_node =
       (_Base_ptr)
       std::
       map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
       ::begin((map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
                *)in_stack_ffffffffffffee18);
  local_988._M_node =
       (_Base_ptr)
       std::
       map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
       ::end((map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
              *)in_stack_ffffffffffffee18);
  while (bVar4 = std::operator!=(&local_980,&local_988), bVar4) {
    local_990 = std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_unsigned_int>_>::operator*
                          ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_unsigned_int>_> *)
                           0x20c448);
    local_991 = 0;
    AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
    AixLog::Tag::Tag((Tag *)0x20c483);
    AixLog::operator<<((ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                       (Tag *)in_stack_ffffffffffffee48._M_node);
    local_9e8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_9e0,&local_9e8);
    AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
    in_stack_ffffffffffffef20 = &local_a61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
    in_stack_ffffffffffffef18 = &local_a89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
    AixLog::Function::Function
              (in_stack_ffffffffffffee30,
               (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
               (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
    AixLog::operator<<((ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                       (Function *)in_stack_ffffffffffffee48._M_node);
    poVar10 = prelude::operator<<((ostream *)in_stack_ffffffffffffee20,
                                  (Displayable *)in_stack_ffffffffffffee18);
    std::operator<<(poVar10," -> ");
    AixLog::Function::~Function(in_stack_ffffffffffffee20);
    std::__cxx11::string::~string(local_a88);
    std::allocator<char>::~allocator(&local_a89);
    std::__cxx11::string::~string(local_a60);
    std::allocator<char>::~allocator((allocator<char> *)&local_a61);
    AixLog::Timestamp::~Timestamp(local_9e0);
    AixLog::Tag::~Tag((Tag *)0x20c620);
    local_a8a = 0;
    AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
    AixLog::Tag::Tag((Tag *)0x20c653);
    AixLog::operator<<((ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                       (Tag *)in_stack_ffffffffffffee48._M_node);
    local_ae0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_ad8,&local_ae0);
    AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
    AixLog::Function::Function
              (in_stack_ffffffffffffee30,
               (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
               (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
    AixLog::operator<<((ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                       (Function *)in_stack_ffffffffffffee48._M_node);
    arm::display_reg_name
              ((ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
               (Reg)((ulong)in_stack_ffffffffffffee48._M_node >> 0x20));
    AixLog::Function::~Function(in_stack_ffffffffffffee20);
    std::__cxx11::string::~string(local_b80);
    std::allocator<char>::~allocator(&local_b81);
    std::__cxx11::string::~string(local_b58);
    std::allocator<char>::~allocator(&local_b59);
    AixLog::Timestamp::~Timestamp(local_ad8);
    AixLog::Tag::~Tag((Tag *)0x20c7d5);
    local_b82 = 0;
    AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
    AixLog::Tag::Tag((Tag *)0x20c808);
    AixLog::operator<<((ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                       (Tag *)in_stack_ffffffffffffee48._M_node);
    local_bd8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    AixLog::Timestamp::Timestamp(local_bd0,&local_bd8);
    AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
    in_stack_ffffffffffffeeb0 = &local_c79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
    AixLog::Function::Function
              (in_stack_ffffffffffffee30,
               (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
               (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
    in_stack_ffffffffffffeea8 =
         (Timestamp *)
         AixLog::operator<<((ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50)
                            ,(Function *)in_stack_ffffffffffffee48._M_node);
    std::ostream::operator<<(in_stack_ffffffffffffeea8,std::endl<char,std::char_traits<char>>);
    AixLog::Function::~Function(in_stack_ffffffffffffee20);
    std::__cxx11::string::~string(local_c78);
    std::allocator<char>::~allocator((allocator<char> *)&local_c79);
    std::__cxx11::string::~string(local_c50);
    std::allocator<char>::~allocator(&local_c51);
    AixLog::Timestamp::~Timestamp(local_bd0);
    AixLog::Tag::~Tag((Tag *)0x20c986);
    std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_unsigned_int>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_unsigned_int>_> *)
               in_stack_ffffffffffffee20);
  }
  AixLog::operator<<(in_stack_ffffffffffffef20,(Severity *)in_stack_ffffffffffffef18);
  AixLog::Tag::Tag((Tag *)0x20cd6b);
  AixLog::operator<<((ostream *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                     (Tag *)in_stack_ffffffffffffee48._M_node);
  local_cd0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(&local_cc8,&local_cd0);
  AixLog::operator<<(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee60,in_stack_ffffffffffffee58,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
  AixLog::Function::Function
            (in_stack_ffffffffffffee30,
             (string *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
             (string *)in_stack_ffffffffffffee20,(size_t)in_stack_ffffffffffffee18);
  poVar10 = AixLog::operator<<((ostream *)
                               CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
                               (Function *)in_stack_ffffffffffffee48._M_node);
  std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
  AixLog::Function::~Function(in_stack_ffffffffffffee20);
  std::__cxx11::string::~string(local_d70);
  std::allocator<char>::~allocator(&local_d71);
  std::__cxx11::string::~string(local_d48);
  std::allocator<char>::~allocator(&local_d49);
  AixLog::Timestamp::~Timestamp(&local_cc8);
  AixLog::Tag::~Tag((Tag *)0x20ced1);
  local_d80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)in_stack_ffffffffffffee18,(key_type *)0x20cee9);
  local_d88._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
              *)in_stack_ffffffffffffee18);
  bVar4 = std::operator==(&local_d80,&local_d88);
  if (bVar4) {
    local_dd8 = 0;
    uStack_dd0 = 0;
    local_de8 = 0;
    uStack_de0 = 0;
    local_df8 = 0;
    uStack_df0 = 0;
    local_dc8 = 0;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
                     *)0x20cf7e);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::
    pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>,_true>
              (in_stack_ffffffffffffee40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffee38._M_current,
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
                *)in_stack_ffffffffffffee30);
    pVar12 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
             ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                       *)in_stack_ffffffffffffee30,
                      (value_type *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28));
    local_e08 = (_Base_ptr)pVar12.first._M_node;
    in_stack_ffffffffffffee57 = pVar12.second;
    local_e00 = in_stack_ffffffffffffee57;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
             *)in_stack_ffffffffffffee20);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
                      *)0x20cfe8);
    in_stack_ffffffffffffee48 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                 *)in_stack_ffffffffffffee18,(key_type *)0x20d000);
    local_e10 = in_stack_ffffffffffffee48._M_node;
    local_d80._M_node = in_stack_ffffffffffffee48._M_node;
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
                *)in_stack_ffffffffffffee20);
  inst = std::
         any_cast<std::unordered_map<std::__cxx11::string,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<mir::inst::VarId,unsigned_int,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>>>>&>
                   ((any *)in_stack_ffffffffffffee20);
  ty = inst;
  local_e18 = inst;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>
              *)in_stack_ffffffffffffee30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28),
             (map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
              *)in_stack_ffffffffffffee20);
  pVar13 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
           ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>_>_>
                     *)in_stack_ffffffffffffee30,
                    (value_type *)CONCAT44(in_stack_ffffffffffffee2c,in_stack_ffffffffffffee28));
  this_01._M_cur =
       (__node_type *)
       pVar13.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>,_true>
       ._M_cur;
  local_e70 = pVar13.second;
  stack_size = CONCAT13(local_e70,(int3)in_stack_ffffffffffffee2c);
  local_e78._M_cur = this_01._M_cur;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>_>
           *)in_stack_ffffffffffffee20);
  std::shared_ptr<mir::types::FunctionTy>::shared_ptr
            (&local_e88,(shared_ptr<mir::types::FunctionTy> *)(*in_RSI + 8));
  arm::Function::Function
            ((Function *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50),
             (string *)in_stack_ffffffffffffee48._M_node,(shared_ptr<mir::types::FunctionTy> *)ty,
             (vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
              *)inst,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
                      *)this_01._M_cur,stack_size);
  std::shared_ptr<mir::types::FunctionTy>::~shared_ptr
            ((shared_ptr<mir::types::FunctionTy> *)0x20d267);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)0x20d274);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             *)this_01._M_cur);
  return in_RDI;
}

Assistant:

arm::Function Codegen::translate_function() {
  init_reg_map();
  scan_stack();
  scan();
  generate_startup();
  std::vector<std::unique_ptr<arm::Inst>> inst_sink = std::move(inst);
  std::set<uint32_t> vis;
  for (auto it = bb_ordering.begin(); it != bb_ordering.end(); it++) {
    auto bb_id = *it;
    inst.clear();
    auto& bb = func.basic_blks.at(bb_id);
    vis.insert(bb_id);
    translate_basic_block(bb);

    std::optional<arm::ConditionCode> second_last_cond =
        std::move(second_last_condition_code);
    second_last_condition_code = {};
    if (auto hint = inline_hint.find(bb_id);
        enable_cond_exec && hint != inline_hint.end()) {
      LOG(TRACE) << "Found inline hint for " << bb_id << std::endl;
      bool can_inline = last_jump.has_value();

      if (can_inline) {
        // for (auto& i : inst) {
        //   if (i->cond != arm::ConditionCode::Always) {
        //     can_inline = false;
        //     LOG(TRACE) << "Inline ruined by a conditional execution"
        //                << std::endl;
        //     break;
        //   }
        // }
        if (bb_id != last_jump->bb_true && bb_id != last_jump->bb_false) {
          can_inline = false;
          LOG(TRACE) << "Inline ruined by not next to source basic block"
                     << std::endl;
        }
        auto next_bb = *(it + 1);
        if (bb.jump.kind == mir::inst::JumpInstructionKind::BrCond) {
          if (auto next_hint = inline_hint.find(next_bb);
              hint != inline_hint.end() && hint->second != next_hint->second) {
            can_inline = false;
            LOG(TRACE) << "Inline ruined by hint not matching (this: ";
            display_cond(hint->second, LOG(TRACE));
            LOG(TRACE) << ", next: ";
            display_cond(next_hint->second, LOG(TRACE));
            LOG(TRACE) << std::endl;
          }
          // if (vis.find(bb.jump.bb_true) != vis.end() ||
          //     vis.find(bb.jump.bb_false) != vis.end()) {
          //   can_inline = false;
          //   LOG(TRACE)
          //       << "Inline ruined by finding successor block in visited set"
          //       << std::endl;
          // }
        }

        // else if (second_last_cond &&
        //            ((bb_id == last_jump->bb_true &&
        //              (*second_last_cond) != last_jump->cond) ||
        //             (bb_id == last_jump->bb_false &&
        //              (*second_last_cond) != invert_cond(last_jump->cond))))
        //              {
        //   can_inline = false;
        //   LOG(TRACE) << "Inline ruined by second last condition: ";
        //   display_cond(*second_last_cond, LOG(TRACE));
        //   LOG(TRACE) << " which conflicts with current one: ";
        //   display_cond(last_jump->cond, LOG(TRACE));
        //   LOG(TRACE) << std::endl;
        // }
      }
      if (can_inline) {
        // Calculate condition code to be used in this block
        ConditionCode cond;
        mir::types::LabelId expected_bb;
        bool inverted;
        if (bb_id == last_jump->bb_true) {
          cond = last_jump->cond;
          expected_bb = last_jump->bb_false;
          inverted = false;
          if (it + 1 != bb_ordering.end() && *(it + 1) == last_jump->bb_false) {
            inst_sink.pop_back();
            inst_sink.pop_back();
          } else {
          }
        } else {
          cond = invert_cond(last_jump->cond);
          expected_bb = last_jump->bb_true;
          inverted = true;
          // since a conditional branch is always emitted in the fashion of
          // "bb_false, bb_true", we can safely pop the second-to-last branch
          // operation and add the condition to bb_true
          if (it + 1 != bb_ordering.end() && *(it + 1) == last_jump->bb_true) {
            inst_sink.pop_back();
            inst_sink.pop_back();
          } else {
            inst_sink.erase(inst_sink.end() - 2);
            inst_sink.back()->cond = last_jump->cond;
          }
        }

        for (auto& i : inst) {
          i->cond = cond;
        }

        second_last_condition_code = cond;
      }
    }

    for (auto& i : inst) {
      inst_sink.push_back(std::move(i));
    }
  }
  inst.clear();
  generate_return_and_cleanup();
  for (auto& i : inst) {
    inst_sink.push_back(std::move(i));
  }

  {
#pragma region passShow
    LOG(TRACE) << "VariableToReg: " << std::endl;
    for (auto& v : reg_map) {
      LOG(TRACE) << v.first << " -> ";
      display_reg_name(LOG(TRACE), v.second);
      LOG(TRACE) << std::endl;
    }
    LOG(TRACE) << std::endl;
#pragma endregion
  }

  {
    // Put variable to vreg map in extra data
    auto data =
        extra_data.find(optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME);
    if (data == extra_data.end()) {
      extra_data.insert({optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME,
                         optimization::MirVariableToArmVRegType()});
      data = extra_data.find(optimization::MIR_VARIABLE_TO_ARM_VREG_DATA_NAME);
    }
    auto& map =
        std::any_cast<optimization::MirVariableToArmVRegType&>(data->second);
    map.insert({func.name, std::move(this->reg_map)});
  }

  return arm::Function(func.name, func.type, std::move(inst_sink),
                       std::move(this->consts), stack_size);
}